

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mconfig.cpp
# Opt level: O3

void MConfig::copyValue(void *dst,int type,QVariant *value)

{
  PrivateShared *pPVar1;
  char cVar2;
  bool bVar3;
  PrivateShared PVar4;
  QMetaType QVar5;
  undefined8 extraout_RAX;
  QMetaTypeInterface *pQVar6;
  uint *ptr;
  longlong lVar7;
  QArrayData *pQVar8;
  PrivateShared *pPVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  QRectF t;
  QUrl in_stack_ffffffffffffffc8;
  QUrl QVar14;
  QMetaType in_stack_ffffffffffffffd0;
  Data *pDVar15;
  char *local_28;
  qsizetype qStack_20;
  
  pPVar9 = (PrivateShared *)&stack0xffffffffffffffc8;
  cVar2 = QVariant::isNull();
  if (cVar2 != '\0') {
    return;
  }
  switch(type) {
  case 1:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      PVar4 = *(PrivateShared *)value;
    }
    else {
      PVar4 = (PrivateShared)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c4d8,&stack0xffffffffffffffc8);
    }
    *(PrivateShared *)dst = PVar4;
    break;
  case 2:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) goto LAB_00106901;
    uVar10 = 0;
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((value->d).field_0x18 & 1) != 0) {
      pPVar9 = (value->d).data.shared;
      value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
    }
    pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType;
LAB_00106c1a:
    QMetaType::convert(QVar5,value,(QMetaType)pQVar6,&stack0xffffffffffffffc8);
    goto LAB_00106c2e;
  case 3:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (!bVar3) {
      uVar10 = 0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
      goto LAB_00106c1a;
    }
LAB_00106901:
    if (((value->d).field_0x18 & 1) != 0) {
      pPVar9 = (value->d).data.shared;
      value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
    }
    uVar10 = *(undefined4 *)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
LAB_00106c2e:
    *(undefined4 *)dst = uVar10;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
switchD_00106733_caseD_4:
    copyValue((MConfig *)&stack0xffffffffffffffc8);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
    _Unwind_Resume(extraout_RAX);
  case 10:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QVar14.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      pDVar15 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      if (QVar14.d != (QUrlPrivate *)0x0) {
        LOCK();
        *(int *)QVar14.d = *(int *)QVar14.d + 1;
        UNLOCK();
      }
    }
    else {
      QVar14.d = (QUrlPrivate *)0x0;
      pDVar15 = (Data *)0x0;
      local_28 = (char *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c468,&stack0xffffffffffffffc8);
    }
    pQVar8 = *dst;
    *(QUrlPrivate **)dst = QVar14.d;
    *(Data **)((long)dst + 8) = pDVar15;
    *(char **)((long)dst + 0x10) = local_28;
    if (pQVar8 == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar7 = 2;
    goto LAB_00106be4;
  case 0xc:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QVar14.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      pDVar15 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      if (QVar14.d != (QUrlPrivate *)0x0) {
        LOCK();
        *(int *)QVar14.d = *(int *)QVar14.d + 1;
        UNLOCK();
      }
    }
    else {
      QVar14.d = (QUrlPrivate *)0x0;
      pDVar15 = (Data *)0x0;
      local_28 = (char *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c3f8,&stack0xffffffffffffffc8);
    }
    pQVar8 = *dst;
    *(QUrlPrivate **)dst = QVar14.d;
    *(Data **)((long)dst + 8) = pDVar15;
    *(char **)((long)dst + 0x10) = local_28;
    if (pQVar8 == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar7 = 1;
LAB_00106be4:
    QArrayData::deallocate(pQVar8,lVar7,8);
    break;
  case 0x10:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QDateTime::QDateTime((QDateTime *)&stack0xffffffffffffffc8,(QDateTime *)value);
    }
    else {
      QDateTime::QDateTime((QDateTime *)&stack0xffffffffffffffc8);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c778,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = in_stack_ffffffffffffffc8.d;
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
    break;
  case 0x11:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QUrl::QUrl((QUrl *)&stack0xffffffffffffffc8,(QUrl *)value);
    }
    else {
      QUrl::QUrl((QUrl *)&stack0xffffffffffffffc8);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c7e8,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = in_stack_ffffffffffffffc8.d;
    QUrl::~QUrl((QUrl *)&stack0xffffffffffffffc8);
    break;
  case 0x13:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QVar14.d = *(QUrlPrivate **)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
      pDVar15 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
    }
    else {
      QVar14.d = (QUrlPrivate *)0x0;
      pDVar15 = (Data *)0xffffffffffffffff;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c698,&stack0xffffffffffffffc8);
    }
    uVar10 = SUB84(QVar14.d,0);
    uVar11 = (undefined4)((ulong)QVar14.d >> 0x20);
    uVar12 = SUB84(pDVar15,0);
    uVar13 = (undefined4)((ulong)pDVar15 >> 0x20);
    goto LAB_00106d10;
  case 0x14:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QVar14.d = *(QUrlPrivate **)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
      pDVar15 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
      local_28 = *(char **)&((PrivateShared *)((long)value + 0x10))->field_0x0;
      qStack_20 = *(qsizetype *)&((PrivateShared *)((long)value + 0x18))->field_0x0;
    }
    else {
      local_28 = (char *)0x0;
      qStack_20 = 0;
      QVar14.d = (QUrlPrivate *)0x0;
      pDVar15 = (Data *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c708,&stack0xffffffffffffffc8);
    }
    uVar10 = SUB84(QVar14.d,0);
    uVar11 = (undefined4)((ulong)QVar14.d >> 0x20);
    uVar12 = SUB84(pDVar15,0);
    uVar13 = (undefined4)((ulong)pDVar15 >> 0x20);
    *(char **)((long)dst + 0x10) = local_28;
    *(qsizetype *)((long)dst + 0x18) = qStack_20;
LAB_00106d10:
    *(undefined4 *)dst = uVar10;
    *(undefined4 *)((long)dst + 4) = uVar11;
    *(undefined4 *)((long)dst + 8) = uVar12;
    *(undefined4 *)((long)dst + 0xc) = uVar13;
    break;
  case 0x19:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      pPVar9 = (PrivateShared *)value;
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        pPVar9 = pPVar9 + *(int *)(pPVar9 + 4);
      }
    }
    else {
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar1 = (value->d).data.shared;
        value = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c5b8,&stack0xffffffffffffffc8);
    }
    *(PrivateShared **)dst = (((Private *)&pPVar9->field_0x0)->data).shared;
    break;
  case 0x1a:
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QVar14.d = (QUrlPrivate *)(((Private *)&((PrivateShared *)value)->field_0x0)->data).shared;
      pDVar15 = *(Data **)&((PrivateShared *)((long)value + 8))->field_0x0;
    }
    else {
      QVar14.d = (QUrlPrivate *)0x0;
      pDVar15 = (Data *)0x0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c628,&stack0xffffffffffffffc8);
    }
    *(QUrlPrivate **)dst = QVar14.d;
    *(Data **)((long)dst + 8) = pDVar15;
    break;
  default:
    if (type != 0x26) goto switchD_00106733_caseD_4;
    bVar3 = operator==(in_stack_ffffffffffffffd0,(QMetaType)in_stack_ffffffffffffffc8.d);
    if (bVar3) {
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      uVar10 = *(undefined4 *)&((Private *)&((PrivateShared *)value)->field_0x0)->data;
    }
    else {
      uVar10 = 0;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((value->d).field_0x18 & 1) != 0) {
        pPVar9 = (value->d).data.shared;
        value = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar5,value,(QMetaType)0x10c548,&stack0xffffffffffffffc8);
    }
    *(undefined4 *)dst = uVar10;
  }
  return;
}

Assistant:

void MConfig::copyValue(void *dst, int type, const QVariant &value)
{
    if (value.isNull()) {
        return;
    }

    // In Qt6 arguments of QVariant::canConvert has changed (QVariant::Type is deprecated)
    #if QT_VERSION >= 0x060000
        #define TYPE QMetaType
    #else
        #define TYPE int
    #endif
    Q_ASSERT(value.canConvert(TYPE(type)));
    #undef TYPE

    switch (type) {
        case QMetaType::Int:
            COPY_TYPE(int)
        case QMetaType::UInt:
            COPY_TYPE(uint)
        case QMetaType::QByteArray:
            COPY_TYPE(QByteArray)
        case QMetaType::QString:
            COPY_TYPE(QString)
        case QMetaType::Bool:
            COPY_TYPE(bool)
        case QMetaType::Float:
            COPY_TYPE(float)
        case QMetaType::QPoint:
            COPY_TYPE(QPoint)
        case QMetaType::QPointF:
            COPY_TYPE(QPointF)
        case QMetaType::QRect:
            COPY_TYPE(QRect)
        case QMetaType::QRectF:
            COPY_TYPE(QRectF)
        case QMetaType::QDateTime:
            COPY_TYPE(QDateTime)
        case QMetaType::QUrl:
            COPY_TYPE(QUrl)
        default:
            qFatal("Config: type unsupported!");
    }
}